

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void RGB24PackedToPlanarHelper_SSE2(__m128i *in,__m128i *out)

{
  longlong lVar1;
  longlong lVar2;
  undefined1 local_c8;
  undefined1 uStack_c7;
  undefined1 uStack_c6;
  undefined1 uStack_c5;
  undefined1 uStack_c4;
  undefined1 uStack_c3;
  undefined1 uStack_c2;
  undefined1 uStack_c1;
  undefined1 local_b8;
  undefined1 uStack_b7;
  undefined1 uStack_b6;
  undefined1 uStack_b5;
  undefined1 uStack_b4;
  undefined1 uStack_b3;
  undefined1 uStack_b2;
  undefined1 uStack_b1;
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  undefined1 local_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 uStack_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  __m128i *out_local;
  __m128i *in_local;
  undefined1 uStack_60;
  undefined1 uStack_5f;
  undefined1 uStack_5e;
  undefined1 uStack_5d;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  undefined1 uStack_20;
  undefined1 uStack_1f;
  undefined1 uStack_1e;
  undefined1 uStack_1d;
  undefined1 uStack_1c;
  undefined1 uStack_1b;
  undefined1 uStack_1a;
  undefined1 uStack_19;
  undefined1 uStack_10;
  undefined1 uStack_f;
  undefined1 uStack_e;
  undefined1 uStack_d;
  undefined1 uStack_c;
  undefined1 uStack_b;
  undefined1 uStack_a;
  undefined1 uStack_9;
  
  lVar1 = (*in)[0];
  lVar2 = in[3][0];
  in_local._0_1_ = (undefined1)lVar1;
  in_local._1_1_ = (undefined1)((ulong)lVar1 >> 8);
  in_local._2_1_ = (undefined1)((ulong)lVar1 >> 0x10);
  in_local._3_1_ = (undefined1)((ulong)lVar1 >> 0x18);
  in_local._4_1_ = (undefined1)((ulong)lVar1 >> 0x20);
  in_local._5_1_ = (undefined1)((ulong)lVar1 >> 0x28);
  in_local._6_1_ = (undefined1)((ulong)lVar1 >> 0x30);
  in_local._7_1_ = (undefined1)((ulong)lVar1 >> 0x38);
  uStack_88 = (undefined1)lVar2;
  uStack_87 = (undefined1)((ulong)lVar2 >> 8);
  uStack_86 = (undefined1)((ulong)lVar2 >> 0x10);
  uStack_85 = (undefined1)((ulong)lVar2 >> 0x18);
  uStack_84 = (undefined1)((ulong)lVar2 >> 0x20);
  uStack_83 = (undefined1)((ulong)lVar2 >> 0x28);
  uStack_82 = (undefined1)((ulong)lVar2 >> 0x30);
  uStack_81 = (undefined1)((ulong)lVar2 >> 0x38);
  *(undefined1 *)*out = in_local._0_1_;
  *(undefined1 *)((long)*out + 1) = uStack_88;
  *(undefined1 *)((long)*out + 2) = in_local._1_1_;
  *(undefined1 *)((long)*out + 3) = uStack_87;
  *(undefined1 *)((long)*out + 4) = in_local._2_1_;
  *(undefined1 *)((long)*out + 5) = uStack_86;
  *(undefined1 *)((long)*out + 6) = in_local._3_1_;
  *(undefined1 *)((long)*out + 7) = uStack_85;
  *(undefined1 *)(*out + 1) = in_local._4_1_;
  *(undefined1 *)((long)*out + 9) = uStack_84;
  *(undefined1 *)((long)*out + 10) = in_local._5_1_;
  *(undefined1 *)((long)*out + 0xb) = uStack_83;
  *(undefined1 *)((long)*out + 0xc) = in_local._6_1_;
  *(undefined1 *)((long)*out + 0xd) = uStack_82;
  *(undefined1 *)((long)*out + 0xe) = in_local._7_1_;
  *(undefined1 *)((long)*out + 0xf) = uStack_81;
  lVar1 = (*in)[1];
  lVar2 = in[3][1];
  uStack_10 = (undefined1)lVar1;
  uStack_f = (undefined1)((ulong)lVar1 >> 8);
  uStack_e = (undefined1)((ulong)lVar1 >> 0x10);
  uStack_d = (undefined1)((ulong)lVar1 >> 0x18);
  uStack_c = (undefined1)((ulong)lVar1 >> 0x20);
  uStack_b = (undefined1)((ulong)lVar1 >> 0x28);
  uStack_a = (undefined1)((ulong)lVar1 >> 0x30);
  uStack_9 = (undefined1)((ulong)lVar1 >> 0x38);
  uStack_20 = (undefined1)lVar2;
  uStack_1f = (undefined1)((ulong)lVar2 >> 8);
  uStack_1e = (undefined1)((ulong)lVar2 >> 0x10);
  uStack_1d = (undefined1)((ulong)lVar2 >> 0x18);
  uStack_1c = (undefined1)((ulong)lVar2 >> 0x20);
  uStack_1b = (undefined1)((ulong)lVar2 >> 0x28);
  uStack_1a = (undefined1)((ulong)lVar2 >> 0x30);
  uStack_19 = (undefined1)((ulong)lVar2 >> 0x38);
  *(undefined1 *)out[1] = uStack_10;
  *(undefined1 *)((long)out[1] + 1) = uStack_20;
  *(undefined1 *)((long)out[1] + 2) = uStack_f;
  *(undefined1 *)((long)out[1] + 3) = uStack_1f;
  *(undefined1 *)((long)out[1] + 4) = uStack_e;
  *(undefined1 *)((long)out[1] + 5) = uStack_1e;
  *(undefined1 *)((long)out[1] + 6) = uStack_d;
  *(undefined1 *)((long)out[1] + 7) = uStack_1d;
  *(undefined1 *)(out[1] + 1) = uStack_c;
  *(undefined1 *)((long)out[1] + 9) = uStack_1c;
  *(undefined1 *)((long)out[1] + 10) = uStack_b;
  *(undefined1 *)((long)out[1] + 0xb) = uStack_1b;
  *(undefined1 *)((long)out[1] + 0xc) = uStack_a;
  *(undefined1 *)((long)out[1] + 0xd) = uStack_1a;
  *(undefined1 *)((long)out[1] + 0xe) = uStack_9;
  *(undefined1 *)((long)out[1] + 0xf) = uStack_19;
  lVar1 = in[1][0];
  lVar2 = in[4][0];
  local_98 = (undefined1)lVar1;
  uStack_97 = (undefined1)((ulong)lVar1 >> 8);
  uStack_96 = (undefined1)((ulong)lVar1 >> 0x10);
  uStack_95 = (undefined1)((ulong)lVar1 >> 0x18);
  uStack_94 = (undefined1)((ulong)lVar1 >> 0x20);
  uStack_93 = (undefined1)((ulong)lVar1 >> 0x28);
  uStack_92 = (undefined1)((ulong)lVar1 >> 0x30);
  uStack_91 = (undefined1)((ulong)lVar1 >> 0x38);
  local_a8 = (undefined1)lVar2;
  uStack_a7 = (undefined1)((ulong)lVar2 >> 8);
  uStack_a6 = (undefined1)((ulong)lVar2 >> 0x10);
  uStack_a5 = (undefined1)((ulong)lVar2 >> 0x18);
  uStack_a4 = (undefined1)((ulong)lVar2 >> 0x20);
  uStack_a3 = (undefined1)((ulong)lVar2 >> 0x28);
  uStack_a2 = (undefined1)((ulong)lVar2 >> 0x30);
  uStack_a1 = (undefined1)((ulong)lVar2 >> 0x38);
  *(undefined1 *)out[2] = local_98;
  *(undefined1 *)((long)out[2] + 1) = local_a8;
  *(undefined1 *)((long)out[2] + 2) = uStack_97;
  *(undefined1 *)((long)out[2] + 3) = uStack_a7;
  *(undefined1 *)((long)out[2] + 4) = uStack_96;
  *(undefined1 *)((long)out[2] + 5) = uStack_a6;
  *(undefined1 *)((long)out[2] + 6) = uStack_95;
  *(undefined1 *)((long)out[2] + 7) = uStack_a5;
  *(undefined1 *)(out[2] + 1) = uStack_94;
  *(undefined1 *)((long)out[2] + 9) = uStack_a4;
  *(undefined1 *)((long)out[2] + 10) = uStack_93;
  *(undefined1 *)((long)out[2] + 0xb) = uStack_a3;
  *(undefined1 *)((long)out[2] + 0xc) = uStack_92;
  *(undefined1 *)((long)out[2] + 0xd) = uStack_a2;
  *(undefined1 *)((long)out[2] + 0xe) = uStack_91;
  *(undefined1 *)((long)out[2] + 0xf) = uStack_a1;
  lVar1 = in[1][1];
  lVar2 = in[4][1];
  uStack_30 = (undefined1)lVar1;
  uStack_2f = (undefined1)((ulong)lVar1 >> 8);
  uStack_2e = (undefined1)((ulong)lVar1 >> 0x10);
  uStack_2d = (undefined1)((ulong)lVar1 >> 0x18);
  uStack_2c = (undefined1)((ulong)lVar1 >> 0x20);
  uStack_2b = (undefined1)((ulong)lVar1 >> 0x28);
  uStack_2a = (undefined1)((ulong)lVar1 >> 0x30);
  uStack_29 = (undefined1)((ulong)lVar1 >> 0x38);
  uStack_40 = (undefined1)lVar2;
  uStack_3f = (undefined1)((ulong)lVar2 >> 8);
  uStack_3e = (undefined1)((ulong)lVar2 >> 0x10);
  uStack_3d = (undefined1)((ulong)lVar2 >> 0x18);
  uStack_3c = (undefined1)((ulong)lVar2 >> 0x20);
  uStack_3b = (undefined1)((ulong)lVar2 >> 0x28);
  uStack_3a = (undefined1)((ulong)lVar2 >> 0x30);
  uStack_39 = (undefined1)((ulong)lVar2 >> 0x38);
  *(undefined1 *)out[3] = uStack_30;
  *(undefined1 *)((long)out[3] + 1) = uStack_40;
  *(undefined1 *)((long)out[3] + 2) = uStack_2f;
  *(undefined1 *)((long)out[3] + 3) = uStack_3f;
  *(undefined1 *)((long)out[3] + 4) = uStack_2e;
  *(undefined1 *)((long)out[3] + 5) = uStack_3e;
  *(undefined1 *)((long)out[3] + 6) = uStack_2d;
  *(undefined1 *)((long)out[3] + 7) = uStack_3d;
  *(undefined1 *)(out[3] + 1) = uStack_2c;
  *(undefined1 *)((long)out[3] + 9) = uStack_3c;
  *(undefined1 *)((long)out[3] + 10) = uStack_2b;
  *(undefined1 *)((long)out[3] + 0xb) = uStack_3b;
  *(undefined1 *)((long)out[3] + 0xc) = uStack_2a;
  *(undefined1 *)((long)out[3] + 0xd) = uStack_3a;
  *(undefined1 *)((long)out[3] + 0xe) = uStack_29;
  *(undefined1 *)((long)out[3] + 0xf) = uStack_39;
  lVar1 = in[2][0];
  lVar2 = in[5][0];
  local_b8 = (undefined1)lVar1;
  uStack_b7 = (undefined1)((ulong)lVar1 >> 8);
  uStack_b6 = (undefined1)((ulong)lVar1 >> 0x10);
  uStack_b5 = (undefined1)((ulong)lVar1 >> 0x18);
  uStack_b4 = (undefined1)((ulong)lVar1 >> 0x20);
  uStack_b3 = (undefined1)((ulong)lVar1 >> 0x28);
  uStack_b2 = (undefined1)((ulong)lVar1 >> 0x30);
  uStack_b1 = (undefined1)((ulong)lVar1 >> 0x38);
  local_c8 = (undefined1)lVar2;
  uStack_c7 = (undefined1)((ulong)lVar2 >> 8);
  uStack_c6 = (undefined1)((ulong)lVar2 >> 0x10);
  uStack_c5 = (undefined1)((ulong)lVar2 >> 0x18);
  uStack_c4 = (undefined1)((ulong)lVar2 >> 0x20);
  uStack_c3 = (undefined1)((ulong)lVar2 >> 0x28);
  uStack_c2 = (undefined1)((ulong)lVar2 >> 0x30);
  uStack_c1 = (undefined1)((ulong)lVar2 >> 0x38);
  *(undefined1 *)out[4] = local_b8;
  *(undefined1 *)((long)out[4] + 1) = local_c8;
  *(undefined1 *)((long)out[4] + 2) = uStack_b7;
  *(undefined1 *)((long)out[4] + 3) = uStack_c7;
  *(undefined1 *)((long)out[4] + 4) = uStack_b6;
  *(undefined1 *)((long)out[4] + 5) = uStack_c6;
  *(undefined1 *)((long)out[4] + 6) = uStack_b5;
  *(undefined1 *)((long)out[4] + 7) = uStack_c5;
  *(undefined1 *)(out[4] + 1) = uStack_b4;
  *(undefined1 *)((long)out[4] + 9) = uStack_c4;
  *(undefined1 *)((long)out[4] + 10) = uStack_b3;
  *(undefined1 *)((long)out[4] + 0xb) = uStack_c3;
  *(undefined1 *)((long)out[4] + 0xc) = uStack_b2;
  *(undefined1 *)((long)out[4] + 0xd) = uStack_c2;
  *(undefined1 *)((long)out[4] + 0xe) = uStack_b1;
  *(undefined1 *)((long)out[4] + 0xf) = uStack_c1;
  lVar1 = in[2][1];
  lVar2 = in[5][1];
  uStack_50 = (undefined1)lVar1;
  uStack_4f = (undefined1)((ulong)lVar1 >> 8);
  uStack_4e = (undefined1)((ulong)lVar1 >> 0x10);
  uStack_4d = (undefined1)((ulong)lVar1 >> 0x18);
  uStack_4c = (undefined1)((ulong)lVar1 >> 0x20);
  uStack_4b = (undefined1)((ulong)lVar1 >> 0x28);
  uStack_4a = (undefined1)((ulong)lVar1 >> 0x30);
  uStack_49 = (undefined1)((ulong)lVar1 >> 0x38);
  uStack_60 = (undefined1)lVar2;
  uStack_5f = (undefined1)((ulong)lVar2 >> 8);
  uStack_5e = (undefined1)((ulong)lVar2 >> 0x10);
  uStack_5d = (undefined1)((ulong)lVar2 >> 0x18);
  uStack_5c = (undefined1)((ulong)lVar2 >> 0x20);
  uStack_5b = (undefined1)((ulong)lVar2 >> 0x28);
  uStack_5a = (undefined1)((ulong)lVar2 >> 0x30);
  uStack_59 = (undefined1)((ulong)lVar2 >> 0x38);
  *(undefined1 *)out[5] = uStack_50;
  *(undefined1 *)((long)out[5] + 1) = uStack_60;
  *(undefined1 *)((long)out[5] + 2) = uStack_4f;
  *(undefined1 *)((long)out[5] + 3) = uStack_5f;
  *(undefined1 *)((long)out[5] + 4) = uStack_4e;
  *(undefined1 *)((long)out[5] + 5) = uStack_5e;
  *(undefined1 *)((long)out[5] + 6) = uStack_4d;
  *(undefined1 *)((long)out[5] + 7) = uStack_5d;
  *(undefined1 *)(out[5] + 1) = uStack_4c;
  *(undefined1 *)((long)out[5] + 9) = uStack_5c;
  *(undefined1 *)((long)out[5] + 10) = uStack_4b;
  *(undefined1 *)((long)out[5] + 0xb) = uStack_5b;
  *(undefined1 *)((long)out[5] + 0xc) = uStack_4a;
  *(undefined1 *)((long)out[5] + 0xd) = uStack_5a;
  *(undefined1 *)((long)out[5] + 0xe) = uStack_49;
  *(undefined1 *)((long)out[5] + 0xf) = uStack_59;
  return;
}

Assistant:

static WEBP_INLINE void RGB24PackedToPlanarHelper_SSE2(
    const __m128i* const in /*in[6]*/, __m128i* const out /*out[6]*/) {
  out[0] = _mm_unpacklo_epi8(in[0], in[3]);
  out[1] = _mm_unpackhi_epi8(in[0], in[3]);
  out[2] = _mm_unpacklo_epi8(in[1], in[4]);
  out[3] = _mm_unpackhi_epi8(in[1], in[4]);
  out[4] = _mm_unpacklo_epi8(in[2], in[5]);
  out[5] = _mm_unpackhi_epi8(in[2], in[5]);
}